

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc.cpp
# Opt level: O2

void crc32(void *key,int len,uint32_t seed,void *out)

{
  long lVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  uint8_t *buf;
  int iVar5;
  
  uVar4 = ~seed;
  lVar3 = 0;
  for (iVar5 = len; 7 < iVar5; iVar5 = iVar5 + -8) {
    lVar1 = lVar3 + 7;
    uVar4 = uVar4 >> 8 ^ crc_table[(byte)(*(byte *)((long)key + lVar3) ^ (byte)uVar4)];
    uVar4 = uVar4 >> 8 ^ crc_table[(byte)(*(byte *)((long)key + lVar3 + 1) ^ (byte)uVar4)];
    uVar4 = uVar4 >> 8 ^ crc_table[(byte)(*(byte *)((long)key + lVar3 + 2) ^ (byte)uVar4)];
    uVar4 = uVar4 >> 8 ^ crc_table[(byte)(*(byte *)((long)key + lVar3 + 3) ^ (byte)uVar4)];
    uVar4 = uVar4 >> 8 ^ crc_table[(byte)(*(byte *)((long)key + lVar3 + 4) ^ (byte)uVar4)];
    uVar4 = uVar4 >> 8 ^ crc_table[(byte)(*(byte *)((long)key + lVar3 + 5) ^ (byte)uVar4)];
    lVar2 = lVar3 + 6;
    lVar3 = lVar3 + 8;
    uVar4 = uVar4 >> 8 ^ crc_table[(byte)(*(byte *)((long)key + lVar2) ^ (byte)uVar4)];
    uVar4 = uVar4 >> 8 ^ crc_table[(byte)(*(byte *)((long)key + lVar1) ^ (byte)uVar4)];
  }
  for (; len != (int)lVar3; lVar3 = lVar3 + 1) {
    uVar4 = uVar4 >> 8 ^ crc_table[(byte)(*(byte *)((long)key + lVar3) ^ (byte)uVar4)];
  }
  *(uint *)out = ~uVar4;
  return;
}

Assistant:

void crc32 ( const void * key, int len, uint32_t seed, void * out )
{
  uint8_t * buf = (uint8_t*)key;
  uint32_t crc = seed ^ 0xffffffffL;

  while (len >= 8)
  {
    DO8(buf);
    len -= 8;
  }

  while(len--)
  {
    DO1(buf);
  } 

  crc ^= 0xffffffffL;

  *(uint32_t*)out = crc;
}